

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.cpp
# Opt level: O0

void __thiscall sf::Texture::update(Texture *this,Texture *texture,uint x,uint y)

{
  ostream *poVar1;
  Uint64 UVar2;
  uint local_b0;
  uint local_a4;
  Image local_78;
  TextureSaver local_58;
  GLenum local_54;
  TextureSaver save;
  GLenum destStatus;
  GLenum sourceStatus;
  GLuint local_44;
  GLuint destFrameBuffer;
  GLuint sourceFrameBuffer;
  GLint drawFramebuffer;
  GLint readFramebuffer;
  TransientContextLock lock_1;
  TransientContextLock local_21;
  uint local_20;
  uint uStack_1c;
  TransientContextLock lock;
  uint y_local;
  uint x_local;
  Texture *texture_local;
  Texture *this_local;
  
  local_20 = y;
  uStack_1c = x;
  if ((this->m_size).x < x + (texture->m_size).x) {
    __assert_fail("x + texture.m_size.x <= m_size.x",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                  ,0x1c1,"void sf::Texture::update(const Texture &, unsigned int, unsigned int)");
  }
  if ((this->m_size).y < y + (texture->m_size).y) {
    __assert_fail("y + texture.m_size.y <= m_size.y",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                  ,0x1c2,"void sf::Texture::update(const Texture &, unsigned int, unsigned int)");
  }
  if ((this->m_texture != 0) && (texture->m_texture != 0)) {
    GlResource::TransientContextLock::TransientContextLock(&local_21);
    priv::ensureExtensionsInit();
    GlResource::TransientContextLock::~TransientContextLock(&local_21);
    if ((sfogl_ext_EXT_framebuffer_object == 0) || (sfogl_ext_EXT_framebuffer_blit == 0)) {
      copyToImage(&local_78,texture);
      update(this,&local_78,uStack_1c,local_20);
      Image::~Image(&local_78);
    }
    else {
      GlResource::TransientContextLock::TransientContextLock
                ((TransientContextLock *)((long)&drawFramebuffer + 3));
      sourceFrameBuffer = 0;
      destFrameBuffer = 0;
      glGetIntegerv(0x8caa,&sourceFrameBuffer);
      priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                         ,0x1d8,"glGetIntegerv(GLEXT_GL_READ_FRAMEBUFFER_BINDING, &readFramebuffer)"
                        );
      glGetIntegerv(0x8ca6,&destFrameBuffer);
      priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                         ,0x1d9,"glGetIntegerv(GLEXT_GL_DRAW_FRAMEBUFFER_BINDING, &drawFramebuffer)"
                        );
      local_44 = 0;
      sourceStatus = 0;
      (*sf_ptrc_glGenFramebuffersEXT)(1,&local_44);
      priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                         ,0x1de,"GLEXT_glGenFramebuffers(1, &sourceFrameBuffer)");
      (*sf_ptrc_glGenFramebuffersEXT)(1,&sourceStatus);
      priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                         ,0x1df,"GLEXT_glGenFramebuffers(1, &destFrameBuffer)");
      if ((local_44 == 0) || (sourceStatus == 0)) {
        poVar1 = err();
        poVar1 = std::operator<<(poVar1,
                                 "Cannot copy texture, failed to create a frame buffer object");
        std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
      }
      else {
        (*sf_ptrc_glBindFramebufferEXT)(0x8ca8,local_44);
        priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                           ,0x1e8,
                           "GLEXT_glBindFramebuffer(GLEXT_GL_READ_FRAMEBUFFER, sourceFrameBuffer)");
        (*sf_ptrc_glFramebufferTexture2DEXT)(0x8ca8,0x8ce0,0xde1,texture->m_texture,0);
        priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                           ,0x1e9,
                           "GLEXT_glFramebufferTexture2D(GLEXT_GL_READ_FRAMEBUFFER, GLEXT_GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, texture.m_texture, 0)"
                          );
        (*sf_ptrc_glBindFramebufferEXT)(0x8ca9,sourceStatus);
        priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                           ,0x1ec,
                           "GLEXT_glBindFramebuffer(GLEXT_GL_DRAW_FRAMEBUFFER, destFrameBuffer)");
        (*sf_ptrc_glFramebufferTexture2DEXT)(0x8ca9,0x8ce0,0xde1,this->m_texture,0);
        priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                           ,0x1ed,
                           "GLEXT_glFramebufferTexture2D(GLEXT_GL_DRAW_FRAMEBUFFER, GLEXT_GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, m_texture, 0)"
                          );
        save.m_textureBinding = (*sf_ptrc_glCheckFramebufferStatusEXT)(0x8ca8);
        priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                           ,0x1f1,
                           "sourceStatus = GLEXT_glCheckFramebufferStatus(GLEXT_GL_READ_FRAMEBUFFER)"
                          );
        local_54 = (*sf_ptrc_glCheckFramebufferStatusEXT)(0x8ca9);
        priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                           ,500,
                           "destStatus = GLEXT_glCheckFramebufferStatus(GLEXT_GL_DRAW_FRAMEBUFFER)")
        ;
        if ((save.m_textureBinding == 0x8cd5) && (local_54 == 0x8cd5)) {
          if ((texture->m_pixelsFlipped & 1U) == 0) {
            local_a4 = 0;
          }
          else {
            local_a4 = (texture->m_size).y;
          }
          if ((texture->m_pixelsFlipped & 1U) == 0) {
            local_b0 = (texture->m_size).y;
          }
          else {
            local_b0 = 0;
          }
          (*sf_ptrc_glBlitFramebufferEXT)
                    (0,local_a4,(texture->m_size).x,local_b0,uStack_1c,local_20,
                     uStack_1c + (texture->m_size).x,local_20 + (texture->m_size).y,0x4000,0x2600);
          priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                             ,0x1fd,
                             "GLEXT_glBlitFramebuffer( 0, texture.m_pixelsFlipped ? texture.m_size.y : 0, texture.m_size.x, texture.m_pixelsFlipped ? 0 : texture.m_size.y, x, y, x + texture.m_size.x, y + texture.m_size.y, GL_COLOR_BUFFER_BIT, GL_NEAREST )"
                            );
        }
        else {
          poVar1 = err();
          poVar1 = std::operator<<(poVar1,
                                   "Cannot copy texture, failed to link texture to frame buffer");
          std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
        }
        (*sf_ptrc_glBindFramebufferEXT)(0x8ca8,sourceFrameBuffer);
        priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                           ,0x205,
                           "GLEXT_glBindFramebuffer(GLEXT_GL_READ_FRAMEBUFFER, readFramebuffer)");
        (*sf_ptrc_glBindFramebufferEXT)(0x8ca9,destFrameBuffer);
        priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                           ,0x206,
                           "GLEXT_glBindFramebuffer(GLEXT_GL_DRAW_FRAMEBUFFER, drawFramebuffer)");
        (*sf_ptrc_glDeleteFramebuffersEXT)(1,&local_44);
        priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                           ,0x209,"GLEXT_glDeleteFramebuffers(1, &sourceFrameBuffer)");
        (*sf_ptrc_glDeleteFramebuffersEXT)(1,&sourceStatus);
        priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                           ,0x20a,"GLEXT_glDeleteFramebuffers(1, &destFrameBuffer)");
        priv::TextureSaver::TextureSaver(&local_58);
        glBindTexture(0xde1,this->m_texture);
        priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                           ,0x210,"glBindTexture(GL_TEXTURE_2D, m_texture)");
        glTexParameteri(0xde1,0x2801,this->m_isSmooth & 1 | 0x2600);
        priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                           ,0x211,
                           "glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, m_isSmooth ? GL_LINEAR : GL_NEAREST)"
                          );
        this->m_hasMipmap = false;
        this->m_pixelsFlipped = false;
        UVar2 = anon_unknown.dwarf_d70e4::getUniqueId();
        this->m_cacheId = UVar2;
        glFlush();
        priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O0/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                           ,0x218,"glFlush()");
        priv::TextureSaver::~TextureSaver(&local_58);
      }
      GlResource::TransientContextLock::~TransientContextLock
                ((TransientContextLock *)((long)&drawFramebuffer + 3));
    }
  }
  return;
}

Assistant:

void Texture::update(const Texture& texture, unsigned int x, unsigned int y)
{
    assert(x + texture.m_size.x <= m_size.x);
    assert(y + texture.m_size.y <= m_size.y);

    if (!m_texture || !texture.m_texture)
        return;

#ifndef SFML_OPENGL_ES

    {
        TransientContextLock lock;

        // Make sure that extensions are initialized
        priv::ensureExtensionsInit();
    }

    if (GLEXT_framebuffer_object && GLEXT_framebuffer_blit)
    {
        TransientContextLock lock;

        // Save the current bindings so we can restore them after we are done
        GLint readFramebuffer = 0;
        GLint drawFramebuffer = 0;

        glCheck(glGetIntegerv(GLEXT_GL_READ_FRAMEBUFFER_BINDING, &readFramebuffer));
        glCheck(glGetIntegerv(GLEXT_GL_DRAW_FRAMEBUFFER_BINDING, &drawFramebuffer));

        // Create the framebuffers
        GLuint sourceFrameBuffer = 0;
        GLuint destFrameBuffer = 0;
        glCheck(GLEXT_glGenFramebuffers(1, &sourceFrameBuffer));
        glCheck(GLEXT_glGenFramebuffers(1, &destFrameBuffer));

        if (!sourceFrameBuffer || !destFrameBuffer)
        {
            err() << "Cannot copy texture, failed to create a frame buffer object" << std::endl;
            return;
        }

        // Link the source texture to the source frame buffer
        glCheck(GLEXT_glBindFramebuffer(GLEXT_GL_READ_FRAMEBUFFER, sourceFrameBuffer));
        glCheck(GLEXT_glFramebufferTexture2D(GLEXT_GL_READ_FRAMEBUFFER, GLEXT_GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, texture.m_texture, 0));

        // Link the destination texture to the destination frame buffer
        glCheck(GLEXT_glBindFramebuffer(GLEXT_GL_DRAW_FRAMEBUFFER, destFrameBuffer));
        glCheck(GLEXT_glFramebufferTexture2D(GLEXT_GL_DRAW_FRAMEBUFFER, GLEXT_GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, m_texture, 0));

        // A final check, just to be sure...
        GLenum sourceStatus;
        glCheck(sourceStatus = GLEXT_glCheckFramebufferStatus(GLEXT_GL_READ_FRAMEBUFFER));

        GLenum destStatus;
        glCheck(destStatus = GLEXT_glCheckFramebufferStatus(GLEXT_GL_DRAW_FRAMEBUFFER));

        if ((sourceStatus == GLEXT_GL_FRAMEBUFFER_COMPLETE) && (destStatus == GLEXT_GL_FRAMEBUFFER_COMPLETE))
        {
            // Blit the texture contents from the source to the destination texture
            glCheck(GLEXT_glBlitFramebuffer(
                0, texture.m_pixelsFlipped ? texture.m_size.y : 0, texture.m_size.x, texture.m_pixelsFlipped ? 0 : texture.m_size.y, // Source rectangle, flip y if source is flipped
                x, y, x + texture.m_size.x, y + texture.m_size.y, // Destination rectangle
                GL_COLOR_BUFFER_BIT, GL_NEAREST
            ));
        }
        else
        {
            err() << "Cannot copy texture, failed to link texture to frame buffer" << std::endl;
        }

        // Restore previously bound framebuffers
        glCheck(GLEXT_glBindFramebuffer(GLEXT_GL_READ_FRAMEBUFFER, readFramebuffer));
        glCheck(GLEXT_glBindFramebuffer(GLEXT_GL_DRAW_FRAMEBUFFER, drawFramebuffer));

        // Delete the framebuffers
        glCheck(GLEXT_glDeleteFramebuffers(1, &sourceFrameBuffer));
        glCheck(GLEXT_glDeleteFramebuffers(1, &destFrameBuffer));

        // Make sure that the current texture binding will be preserved
        priv::TextureSaver save;

        // Set the parameters of this texture
        glCheck(glBindTexture(GL_TEXTURE_2D, m_texture));
        glCheck(glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, m_isSmooth ? GL_LINEAR : GL_NEAREST));
        m_hasMipmap = false;
        m_pixelsFlipped = false;
        m_cacheId = getUniqueId();

        // Force an OpenGL flush, so that the texture data will appear updated
        // in all contexts immediately (solves problems in multi-threaded apps)
        glCheck(glFlush());

        return;
    }

#endif // SFML_OPENGL_ES

    update(texture.copyToImage(), x, y);
}